

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

double __thiscall icu_63::CalendarAstronomer::getJulianCentury(CalendarAstronomer *this)

{
  UBool UVar1;
  
  UVar1 = uprv_isNaN_63(this->julianCentury);
  if (UVar1 != '\0') {
    UVar1 = uprv_isNaN_63(this->julianDay);
    if (UVar1 != '\0') {
      this->julianDay = (this->fTime + 210866760000000.0) / 86400000.0;
    }
    this->julianCentury = (this->julianDay + -2415020.0) / 36525.0;
  }
  return this->julianCentury;
}

Assistant:

double CalendarAstronomer::getJulianCentury() {
    if (isINVALID(julianCentury)) {
        julianCentury = (getJulianDay() - 2415020.0) / 36525.0;
    }
    return julianCentury;
}